

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cs_system_impl::get_file_type(string *path)

{
  int iVar1;
  char *__file;
  stat s;
  stat local_a0;
  int local_4;
  
  memset(&local_a0,0,0x90);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_a0);
  if (iVar1 == 0) {
    if ((local_a0.st_mode & 0xf000) == 0x4000) {
      local_4 = 4;
    }
    else if ((local_a0.st_mode & 0xf000) == 0x8000) {
      local_4 = 8;
    }
    else if ((local_a0.st_mode & 0xf000) == 0xa000) {
      local_4 = 10;
    }
    else if ((local_a0.st_mode & 0xf000) == 0x1000) {
      local_4 = 1;
    }
    else if ((local_a0.st_mode & 0xf000) == 0x6000) {
      local_4 = 6;
    }
    else if ((local_a0.st_mode & 0xf000) == 0x2000) {
      local_4 = 2;
    }
    else if ((local_a0.st_mode & 0xf000) == 0xc000) {
      local_4 = 0xc;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int get_file_type(const std::string &path)
	{
		struct stat s {};
		if (stat(path.c_str(), &s) != 0) {
			return DT_UNKNOWN;
		}
		if (S_ISDIR(s.st_mode)) {
			return DT_DIR;
		}
		else if (S_ISREG(s.st_mode)) {
			return DT_REG;
		}
		else if (S_ISLNK(s.st_mode)) {
			return DT_LNK;
		}
		else if (S_ISFIFO(s.st_mode)) {
			return DT_FIFO;
		}
		else if (S_ISBLK(s.st_mode)) {
			return DT_BLK;
		}
		else if (S_ISCHR(s.st_mode)) {
			return DT_CHR;
		}
		else if (S_ISSOCK(s.st_mode)) {
			return DT_SOCK;
		}
		return DT_UNKNOWN;
	}